

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase679::run(TestCase679 *this)

{
  __pid_t _Var1;
  bool local_cd;
  __pid_t local_cc;
  int iStack_c8;
  bool _kj_shouldLog_2;
  bool local_c3;
  bool local_c2;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  undefined1 *puStack_c0;
  Promise<int> local_b8;
  Own<kj::(anonymous_namespace)::DestructorDetector> local_a8;
  Type local_98;
  Own<kj::(anonymous_namespace)::DestructorDetector> local_90;
  undefined1 local_80 [8];
  Promise<int> promise;
  undefined1 local_60 [8];
  WaitScope waitScope;
  EventLoop loop;
  bool destroyed;
  TestCase679 *this_local;
  
  loop.daemons.ptr._7_1_ = 0;
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  WaitScope::WaitScope((WaitScope *)local_60,(EventLoop *)&waitScope.busyPollInterval);
  local_98.destroyed = (bool *)((long)&loop.daemons.ptr + 7);
  evalLater<kj::(anonymous_namespace)::TestCase679::run()::__0>((kj *)&local_90,&local_98);
  heap<kj::(anonymous_namespace)::DestructorDetector,bool&>
            ((kj *)&local_a8,(bool *)((long)&loop.daemons.ptr + 7));
  Promise<int>::attach<kj::Own<kj::(anonymous_namespace)::DestructorDetector>>
            ((Promise<int> *)local_80,&local_90);
  Own<kj::(anonymous_namespace)::DestructorDetector>::~Own(&local_a8);
  Promise<int>::~Promise((Promise<int> *)&local_90);
  puStack_c0 = (undefined1 *)((long)&loop.daemons.ptr + 7);
  Promise<int>::then<kj::(anonymous_namespace)::TestCase679::run()::__1,kj::_::PropagateException>
            (&local_b8,(Type *)local_80,(PropagateException *)&stack0xffffffffffffff40);
  Promise<int>::operator=((Promise<int> *)local_80,&local_b8);
  Promise<int>::~Promise(&local_b8);
  if ((loop.daemons.ptr._7_1_ & 1) != 0) {
    local_c2 = _::Debug::shouldLog(ERROR);
    while (local_c2 != false) {
      _::Debug::log<char_const(&)[30]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x2b7,ERROR,"\"failed: expected \" \"!(destroyed)\"",
                 (char (*) [30])"failed: expected !(destroyed)");
      local_c2 = false;
    }
  }
  _Var1 = Promise<int>::wait((Promise<int> *)local_80,local_60);
  if (_Var1 != 0x1bc) {
    local_c3 = _::Debug::shouldLog(ERROR);
    while (local_c3 != false) {
      iStack_c8 = 0x1bc;
      local_cc = Promise<int>::wait((Promise<int> *)local_80,local_60);
      _::Debug::log<char_const(&)[52],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x2b8,ERROR,
                 "\"failed: expected \" \"(444) == (promise.wait(waitScope))\", 444, promise.wait(waitScope)"
                 ,(char (*) [52])"failed: expected (444) == (promise.wait(waitScope))",
                 &stack0xffffffffffffff38,&local_cc);
      local_c3 = false;
    }
  }
  if ((loop.daemons.ptr._7_1_ & 1) == 0) {
    local_cd = _::Debug::shouldLog(ERROR);
    while (local_cd != false) {
      _::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x2b9,ERROR,"\"failed: expected \" \"destroyed\"",
                 (char (*) [27])"failed: expected destroyed");
      local_cd = false;
    }
  }
  Promise<int>::~Promise((Promise<int> *)local_80);
  WaitScope::~WaitScope((WaitScope *)local_60);
  EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Async, Attach) {
  bool destroyed = false;

  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater([&]() {
    EXPECT_FALSE(destroyed);
    return 123;
  }).attach(kj::heap<DestructorDetector>(destroyed));

  promise = promise.then([&](int i) {
    EXPECT_TRUE(destroyed);
    return i + 321;
  });

  EXPECT_FALSE(destroyed);
  EXPECT_EQ(444, promise.wait(waitScope));
  EXPECT_TRUE(destroyed);
}